

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Events.c
# Opt level: O1

void event_exercise_time(tgestate_t *state)

{
  uint8_t *puVar1;
  
  state->bell = '(';
  if (state->in_solitary == '\0') {
    puVar1 = &state->vischars[0].flags;
    *puVar1 = *puVar1 & 0xbf;
    state->vischars[0].route.index = 0x8e;
    state->vischars[0].route.step = '\x04';
    set_route(state,state->vischars);
  }
  set_prisoners_and_guards_route_B(state,(route_t *)&set_route_go_to_yard_reversed_t14);
  return;
}

Assistant:

static void event_exercise_time(tgestate_t *state) // end of exercise time?
{
  assert(state != NULL);

  state->bell = bell_RING_40_TIMES;
  set_route_go_to_yard_reversed(state);
}